

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

string * readable_size_abi_cxx11_(string *__return_storage_ptr__,uint64_t size)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  char FILE_SIZE_UNITS [8] [3];
  ostringstream out;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  char local_1c8 [32];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8[0] = 'B';
  local_1c8[1] = ' ';
  local_1c8[2] = '\0';
  local_1c8[3] = 'K';
  local_1c8[4] = 'B';
  local_1c8[5] = '\0';
  local_1c8[6] = 'M';
  local_1c8[7] = 'B';
  local_1c8[8] = '\0';
  local_1c8[9] = 'G';
  local_1c8[10] = 'B';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = 'T';
  local_1c8[0xd] = 'B';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = 'P';
  local_1c8[0x10] = 'B';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = 'E';
  local_1c8[0x13] = 'B';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = 'Z';
  local_1c8[0x16] = 'B';
  local_1c8[0x17] = '\0';
  if (size < 0x400) {
    uVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      uVar3 = size;
      lVar2 = lVar2 + 1;
      size = uVar3 >> 10;
    } while (0xfffff < uVar3);
    uVar3 = (ulong)((uint)uVar3 & 0x3ff);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  if (99 < (uint)uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    std::ostream::operator<<((ostream *)local_1a8,(int)(uVar3 / 100));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = local_1c8 + lVar2 * 3;
  local_1e8 = local_1d8;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,__s,__s + sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1e8,local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string readable_size(uint64_t size)
{
    constexpr const char FILE_SIZE_UNITS[8][3]{"B ", "KB", "MB", "GB", "TB", "PB", "EB", "ZB"};
    uint64_t s = size, r = 0;
    int idx = 0;
    while (s / 1024 > 0)
    {
        r = s % 1024;
        s = s / 1024;
        idx++;
    }
    int point = (int)(r / 100);
    std::ostringstream out;
    out << "" << s;
    if (point != 0)
        out << "." << point;
    out << " " << std::string(FILE_SIZE_UNITS[idx]);
    return out.str();
}